

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kitDsd.c
# Opt level: O0

uint * Kit_DsdTruthComputeNode_rec(Kit_DsdMan_t *p,Kit_DsdNtk_t *pNtk,int Id)

{
  ushort uVar1;
  uint *pIn1;
  CloudManager *dd;
  int iVar2;
  uint uVar3;
  Kit_DsdObj_t *pObj_00;
  uint *puVar4;
  uint local_cc;
  uint fCompl;
  uint iLit;
  uint i;
  uint *pTruthTemp;
  uint *pTruthFans [16];
  uint *pTruthRes;
  Kit_DsdObj_t *pObj;
  int Id_local;
  Kit_DsdNtk_t *pNtk_local;
  Kit_DsdMan_t *p_local;
  
  pObj_00 = Kit_DsdNtkObj(pNtk,Id);
  pTruthFans[0xf] = (uint *)Vec_PtrEntry(p->vTtNodes,Id);
  if (pObj_00 == (Kit_DsdObj_t *)0x0) {
    p_local = (Kit_DsdMan_t *)pTruthFans[0xf];
    if ((int)(uint)pNtk->nVars <= Id) {
      __assert_fail("Id < pNtk->nVars",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/bool/kit/kitDsd.c"
                    ,0x23f,
                    "unsigned int *Kit_DsdTruthComputeNode_rec(Kit_DsdMan_t *, Kit_DsdNtk_t *, int)"
                   );
    }
  }
  else if (((uint)*pObj_00 >> 6 & 7) == 1) {
    if ((uint)*pObj_00 >> 0x1a != 0) {
      __assert_fail("pObj->nFans == 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/bool/kit/kitDsd.c"
                    ,0x246,
                    "unsigned int *Kit_DsdTruthComputeNode_rec(Kit_DsdMan_t *, Kit_DsdNtk_t *, int)"
                   );
    }
    Kit_TruthFill(pTruthFans[0xf],(uint)pNtk->nVars);
    p_local = (Kit_DsdMan_t *)pTruthFans[0xf];
  }
  else if (((uint)*pObj_00 >> 6 & 7) == 2) {
    if ((uint)*pObj_00 >> 0x1a != 1) {
      __assert_fail("pObj->nFans == 1",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/bool/kit/kitDsd.c"
                    ,0x24e,
                    "unsigned int *Kit_DsdTruthComputeNode_rec(Kit_DsdMan_t *, Kit_DsdNtk_t *, int)"
                   );
    }
    uVar1 = *(ushort *)(pObj_00 + 1);
    iVar2 = Abc_Lit2Var((uint)uVar1);
    pTruthTemp = Kit_DsdTruthComputeNode_rec(p,pNtk,iVar2);
    iVar2 = Abc_LitIsCompl((uint)uVar1);
    if (iVar2 == 0) {
      Kit_TruthCopy(pTruthFans[0xf],pTruthTemp,(uint)pNtk->nVars);
    }
    else {
      Kit_TruthNot(pTruthFans[0xf],pTruthTemp,(uint)pNtk->nVars);
    }
    p_local = (Kit_DsdMan_t *)pTruthFans[0xf];
  }
  else {
    for (fCompl = 0; fCompl < (uint)*pObj_00 >> 0x1a; fCompl = fCompl + 1) {
      iVar2 = Abc_Lit2Var((uint)*(ushort *)(&pObj_00[1].field_0x0 + (ulong)fCompl * 2));
      puVar4 = Kit_DsdTruthComputeNode_rec(p,pNtk,iVar2);
      pTruthFans[(ulong)fCompl - 1] = puVar4;
    }
    if (((uint)*pObj_00 >> 6 & 7) == 3) {
      Kit_TruthFill(pTruthFans[0xf],(uint)pNtk->nVars);
      for (fCompl = 0; puVar4 = pTruthFans[0xf], fCompl < (uint)*pObj_00 >> 0x1a;
          fCompl = fCompl + 1) {
        pIn1 = pTruthFans[(ulong)fCompl - 1];
        uVar1 = pNtk->nVars;
        iVar2 = Abc_LitIsCompl((uint)*(ushort *)(&pObj_00[1].field_0x0 + (ulong)fCompl * 2));
        Kit_TruthAndPhase(puVar4,puVar4,pIn1,(uint)uVar1,0,iVar2);
      }
      p_local = (Kit_DsdMan_t *)pTruthFans[0xf];
    }
    else if (((uint)*pObj_00 >> 6 & 7) == 4) {
      Kit_TruthClear(pTruthFans[0xf],(uint)pNtk->nVars);
      local_cc = 0;
      for (fCompl = 0; fCompl < (uint)*pObj_00 >> 0x1a; fCompl = fCompl + 1) {
        uVar1 = *(ushort *)(&pObj_00[1].field_0x0 + (ulong)fCompl * 2);
        Kit_TruthXor(pTruthFans[0xf],pTruthFans[0xf],pTruthFans[(ulong)fCompl - 1],(uint)pNtk->nVars
                    );
        uVar3 = Abc_LitIsCompl((uint)uVar1);
        local_cc = uVar3 ^ local_cc;
      }
      if (local_cc != 0) {
        Kit_TruthNot(pTruthFans[0xf],pTruthFans[0xf],(uint)pNtk->nVars);
      }
      p_local = (Kit_DsdMan_t *)pTruthFans[0xf];
    }
    else {
      if (((uint)*pObj_00 >> 6 & 7) != 5) {
        __assert_fail("pObj->Type == KIT_DSD_PRIME",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/bool/kit/kitDsd.c"
                      ,0x272,
                      "unsigned int *Kit_DsdTruthComputeNode_rec(Kit_DsdMan_t *, Kit_DsdNtk_t *, int)"
                     );
      }
      for (fCompl = 0; fCompl < (uint)*pObj_00 >> 0x1a; fCompl = fCompl + 1) {
        iVar2 = Abc_LitIsCompl((uint)*(ushort *)(&pObj_00[1].field_0x0 + (ulong)fCompl * 2));
        if (iVar2 != 0) {
          Kit_TruthNot(pTruthFans[(ulong)fCompl - 1],pTruthFans[(ulong)fCompl - 1],(uint)pNtk->nVars
                      );
        }
      }
      dd = p->dd;
      puVar4 = Kit_DsdObjTruth(pObj_00);
      puVar4 = Kit_TruthCompose(dd,puVar4,(uint)*pObj_00 >> 0x1a,&pTruthTemp,(uint)pNtk->nVars,
                                p->vTtBdds,p->vNodes);
      Kit_TruthCopy(pTruthFans[0xf],puVar4,(uint)pNtk->nVars);
      p_local = (Kit_DsdMan_t *)pTruthFans[0xf];
    }
  }
  return (uint *)p_local;
}

Assistant:

unsigned * Kit_DsdTruthComputeNode_rec( Kit_DsdMan_t * p, Kit_DsdNtk_t * pNtk, int Id )
{
    Kit_DsdObj_t * pObj;
    unsigned * pTruthRes, * pTruthFans[16], * pTruthTemp;
    unsigned i, iLit, fCompl;
//    unsigned m, nMints, * pTruthPrime, * pTruthMint; 

    // get the node with this ID
    pObj = Kit_DsdNtkObj( pNtk, Id );
    pTruthRes = (unsigned *)Vec_PtrEntry( p->vTtNodes, Id );

    // special case: literal of an internal node
    if ( pObj == NULL )
    {
        assert( Id < pNtk->nVars );
        return pTruthRes;
    }

    // constant node
    if ( pObj->Type == KIT_DSD_CONST1 )
    {
        assert( pObj->nFans == 0 );
        Kit_TruthFill( pTruthRes, pNtk->nVars );
        return pTruthRes;
    }

    // elementary variable node
    if ( pObj->Type == KIT_DSD_VAR )
    {
        assert( pObj->nFans == 1 );
        iLit = pObj->pFans[0];
        pTruthFans[0] = Kit_DsdTruthComputeNode_rec( p, pNtk, Abc_Lit2Var(iLit) );
        if ( Abc_LitIsCompl(iLit) )
            Kit_TruthNot( pTruthRes, pTruthFans[0], pNtk->nVars );
        else
            Kit_TruthCopy( pTruthRes, pTruthFans[0], pNtk->nVars );
        return pTruthRes;
    }

    // collect the truth tables of the fanins
    Kit_DsdObjForEachFanin( pNtk, pObj, iLit, i )
        pTruthFans[i] = Kit_DsdTruthComputeNode_rec( p, pNtk, Abc_Lit2Var(iLit) );
    // create the truth table

    // simple gates
    if ( pObj->Type == KIT_DSD_AND )
    {
        Kit_TruthFill( pTruthRes, pNtk->nVars );
        Kit_DsdObjForEachFanin( pNtk, pObj, iLit, i )
            Kit_TruthAndPhase( pTruthRes, pTruthRes, pTruthFans[i], pNtk->nVars, 0, Abc_LitIsCompl(iLit) );
        return pTruthRes;
    }
    if ( pObj->Type == KIT_DSD_XOR )
    {
        Kit_TruthClear( pTruthRes, pNtk->nVars );
        fCompl = 0;
        Kit_DsdObjForEachFanin( pNtk, pObj, iLit, i )
        {
            Kit_TruthXor( pTruthRes, pTruthRes, pTruthFans[i], pNtk->nVars );
            fCompl ^= Abc_LitIsCompl(iLit);
        }
        if ( fCompl )
            Kit_TruthNot( pTruthRes, pTruthRes, pNtk->nVars );
        return pTruthRes;
    }
    assert( pObj->Type == KIT_DSD_PRIME );
/*
    // get the truth table of the prime node
    pTruthPrime = Kit_DsdObjTruth( pObj );
    // get storage for the temporary minterm
    pTruthMint = Vec_PtrEntry(p->vTtNodes, pNtk->nVars + pNtk->nNodes);
    // go through the minterms
    nMints = (1 << pObj->nFans);
    Kit_TruthClear( pTruthRes, pNtk->nVars );
    for ( m = 0; m < nMints; m++ )
    {
        if ( !Kit_TruthHasBit(pTruthPrime, m) )
            continue;
        Kit_TruthFill( pTruthMint, pNtk->nVars );
        Kit_DsdObjForEachFanin( pNtk, pObj, iLit, i )
            Kit_TruthAndPhase( pTruthMint, pTruthMint, pTruthFans[i], pNtk->nVars, 0, ((m & (1<<i)) == 0) ^ Abc_LitIsCompl(iLit) );
        Kit_TruthOr( pTruthRes, pTruthRes, pTruthMint, pNtk->nVars );
    }
*/
    Kit_DsdObjForEachFanin( pNtk, pObj, iLit, i )
        if ( Abc_LitIsCompl(iLit) )
            Kit_TruthNot( pTruthFans[i], pTruthFans[i], pNtk->nVars );
    pTruthTemp = Kit_TruthCompose( p->dd, Kit_DsdObjTruth(pObj), pObj->nFans, pTruthFans, pNtk->nVars, p->vTtBdds, p->vNodes );
    Kit_TruthCopy( pTruthRes, pTruthTemp, pNtk->nVars );
    return pTruthRes;
}